

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalUnion::BuildPipelines
          (PhysicalUnion *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> _Var2;
  PhysicalOperator *this_00;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  optional_ptr<duckdb::PhysicalOperator,_true> oVar7;
  Pipeline *dependant;
  reference pvVar8;
  ClientContext *context;
  byte order_matters;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_01;
  optional_ptr<duckdb::MetaPipeline,_true> last_child_ptr;
  optional_ptr<duckdb::PhysicalOperator,_true> sink;
  OperatorPartitionInfo partition_info;
  optional_ptr<duckdb::MetaPipeline,_true> local_a0;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  local_98;
  optional_ptr<duckdb::PhysicalOperator,_true> local_78;
  Pipeline *local_70;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  local_68;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  local_48;
  
  _Var1._M_head_impl =
       (this->super_PhysicalOperator).op_state.
       super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
       .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  if (_Var1._M_head_impl != (GlobalOperatorState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalOperatorState[1])();
  }
  _Var2._M_head_impl =
       (this->super_PhysicalOperator).sink_state.
       super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  if (_Var2._M_head_impl != (GlobalSinkState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_GlobalSinkState + 8))();
  }
  oVar7 = MetaPipeline::GetSink(meta_pipeline);
  order_matters = this->allow_out_of_order ^ 1;
  local_78 = oVar7;
  bVar5 = Pipeline::IsOrderDependent(current);
  if (bVar5) {
    order_matters = 1;
  }
  if (oVar7.ptr != (PhysicalOperator *)0x0) {
    local_70 = current;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_78);
    iVar6 = (*(local_78.ptr)->_vptr_PhysicalOperator[0x24])();
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_78);
    (*(local_78.ptr)->_vptr_PhysicalOperator[0x23])(&local_68);
    if ((char)local_68.
              super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != '\0') {
      order_matters = 1;
    }
    bVar3 = order_matters;
    if ((char)iVar6 != '\0') {
      bVar3 = 1;
    }
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_78);
    iVar6 = (*(local_78.ptr)->_vptr_PhysicalOperator[0x22])();
    order_matters = 1;
    if ((char)iVar6 != '\0') {
      order_matters = bVar3;
    }
    current = local_70;
    if (local_68.
        super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      current = local_70;
    }
  }
  dependant = MetaPipeline::CreateUnionPipeline(meta_pipeline,current,(bool)order_matters);
  this_01 = &(this->super_PhysicalOperator).children;
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_01,0);
  (*pvVar8->_M_data->_vptr_PhysicalOperator[0x26])(pvVar8->_M_data,current,meta_pipeline);
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.ptr = (MetaPipeline *)0x0;
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_01,0);
  bVar5 = ContainsSink(pvVar8->_M_data);
  if (bVar5) {
    pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_01,0);
    this_00 = pvVar8->_M_data;
    context = Pipeline::GetClientContext(current);
    bVar5 = PhysicalOperator::CanSaturateThreads(this_00,context);
  }
  else {
    bVar5 = false;
  }
  bVar4 = true;
  if ((bVar5 != false) || ((bool)order_matters != false)) {
    MetaPipeline::AddDependenciesFrom
              ((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)&local_48,meta_pipeline,
               dependant,dependant,false);
    local_68.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.
         super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_98.
         super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_98.
         super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ::~vector(&local_68);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ::~vector(&local_48);
    if (bVar5 != false) {
      local_a0.ptr = MetaPipeline::GetLastChild(meta_pipeline);
      bVar4 = false;
    }
  }
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_01,1);
  (*pvVar8->_M_data->_vptr_PhysicalOperator[0x26])(pvVar8->_M_data,dependant,meta_pipeline);
  if (!bVar4) {
    optional_ptr<duckdb::MetaPipeline,_true>::CheckValid(&local_a0);
    MetaPipeline::AddRecursiveDependencies
              (meta_pipeline,(vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)&local_98,
               local_a0.ptr);
  }
  MetaPipeline::AssignNextBatchIndex(meta_pipeline,dependant);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void PhysicalUnion::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	op_state.reset();
	sink_state.reset();

	// order matters if any of the downstream operators are order dependent,
	// or if the sink preserves order, but does not support batch indices to do so
	auto sink = meta_pipeline.GetSink();
	bool order_matters = false;
	if (!allow_out_of_order) {
		order_matters = true;
	}
	if (current.IsOrderDependent()) {
		order_matters = true;
	}
	if (sink) {
		if (sink->SinkOrderDependent()) {
			order_matters = true;
		}
		auto partition_info = sink->RequiredPartitionInfo();
		if (partition_info.batch_index) {
			order_matters = true;
		}
		if (!sink->ParallelSink()) {
			order_matters = true;
		}
	}

	// create a union pipeline that has identical dependencies to 'current'
	auto &union_pipeline = meta_pipeline.CreateUnionPipeline(current, order_matters);

	// continue with the current pipeline
	children[0].get().BuildPipelines(current, meta_pipeline);

	vector<shared_ptr<Pipeline>> dependencies;
	optional_ptr<MetaPipeline> last_child_ptr;
	// users commonly UNION ALL together a bunch of cheap scan pipelines (e.g., instead of a multi file list)
	// in these cases, we don't want to avoid breadth-first plan evaluation,
	// as it doesn't pose a threat to memory usage (it's just a bunch of straight scans)
	const auto can_saturate_threads =
	    ContainsSink(children[0]) && children[0].get().CanSaturateThreads(current.GetClientContext());
	if (order_matters || can_saturate_threads) {
		// we add dependencies if order matters: union_pipeline comes after all pipelines created by building current
		dependencies = meta_pipeline.AddDependenciesFrom(union_pipeline, union_pipeline, false);
		// we also add dependencies if the LHS child can saturate all available threads
		// in that case, we recursively make all RHS children depend on the LHS.
		// This prevents breadth-first plan evaluation
		if (can_saturate_threads) {
			last_child_ptr = meta_pipeline.GetLastChild();
		}
	}

	// build the union pipeline
	children[1].get().BuildPipelines(union_pipeline, meta_pipeline);

	if (last_child_ptr) {
		// the pointer was set, set up the dependencies
		meta_pipeline.AddRecursiveDependencies(dependencies, *last_child_ptr);
	}

	// Assign proper batch index to the union pipeline
	// This needs to happen after the pipelines have been built because unions can be nested
	meta_pipeline.AssignNextBatchIndex(union_pipeline);
}